

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_class_32_4_5f7794cc func;
  anon_class_32_4_5f7794cc local_70;
  EpsCopyOutputStream **local_50;
  MessageLite *local_48;
  EpsCopyOutputStream *local_40;
  ExtensionSet *local_38;
  ExtensionSet *local_30;
  ExtensionSet *extension_set;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  local_50 = &stream_local;
  func.extendee = extendee;
  func.target = (uint8_t **)local_50;
  func.stream = stream;
  func.extension_set = this;
  local_48 = extendee;
  local_40 = stream;
  local_38 = this;
  local_30 = this;
  extension_set = (ExtensionSet *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)extendee;
  extendee_local = (MessageLite *)this;
  ForEach<google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0>
            (&local_70,this,func);
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const ExtensionSet* extension_set = this;
  ForEach([&target, extendee, stream, extension_set](int number,
                                                     const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        extendee, extension_set, number, target, stream);
  });
  return target;
}